

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void PrintFunction(InstructionVMGraphContext *ctx,VmFunction *function)

{
  FunctionData *pFVar1;
  char *pcVar2;
  char *pcVar3;
  ModuleData *pMVar4;
  ScopeData *pSVar5;
  VariableData *pVVar6;
  VmConstant *pVVar7;
  VmValue *value;
  VmBlock *block;
  bool bVar8;
  uint uVar9;
  ArgumentData *pAVar10;
  VariableData **ppVVar11;
  VmConstant **ppVVar12;
  VmValue **ppVVar13;
  char *pcVar14;
  char *pcVar15;
  bool bVar16;
  VmBlock **ppVVar17;
  uint i;
  uint uVar18;
  uint index;
  uint index_00;
  char *pcVar19;
  
  pFVar1 = function->function;
  if (pFVar1 == (FunctionData *)0x0) {
    PrintLine(ctx,"function global()");
LAB_001b6a5d:
    pSVar5 = function->scope;
    if (pSVar5 != (ScopeData *)0x0) {
      for (uVar18 = 0; uVar18 < (pSVar5->allVariables).count; uVar18 = uVar18 + 1) {
        ppVVar11 = SmallArray<VariableData_*,_4U>::operator[](&pSVar5->allVariables,uVar18);
        pVVar6 = *ppVVar11;
        if ((pVVar6->isAlloca != true) || ((pVVar6->users).count != 0)) {
          pcVar19 = "imported ";
          if (pVVar6->importModule == (ModuleData *)0x0) {
            pcVar19 = "";
          }
          pcVar15 = (pVVar6->type->name).begin;
          Print(ctx,"// %s0x%x: %.*s %.*s",pcVar19,(ulong)pVVar6->offset,
                (ulong)(uint)(*(int *)&(pVVar6->type->name).end - (int)pcVar15),pcVar15,
                (ulong)(uint)(*(int *)&(pVVar6->name->name).end - (int)(pVVar6->name->name).begin));
          if (ctx->showUsers == true) {
            Print(ctx," [");
          }
          bVar16 = false;
          for (index_00 = 0; index_00 < (pVVar6->users).count; index_00 = index_00 + 1) {
            ppVVar12 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar6->users,index_00);
            pVVar7 = *ppVVar12;
            for (index = 0; index < (pVVar7->super_VmValue).users.count; index = index + 1) {
              if ((index != 0 || index_00 != 0) && (ctx->showUsers != false)) {
                Print(ctx,", ");
              }
              ppVVar13 = SmallArray<VmValue_*,_8U>::operator[](&(pVVar7->super_VmValue).users,index)
              ;
              value = *ppVVar13;
              if ((value == (VmValue *)0x0) || (value->typeID != 2)) {
                __assert_fail("!\"invalid constant use\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmGraph.cpp"
                              ,0x2b3,"void PrintFunction(InstructionVMGraphContext &, VmFunction *)"
                             );
              }
              if (ctx->showUsers == true) {
                PrintName(ctx,value,(VmFunction *)value[1].users.data[0x16] != function,true);
              }
              uVar9 = *(uint *)&value[1]._vptr_VmValue;
              if (uVar9 < 7) {
LAB_001b6be0:
                bVar8 = bVar16;
              }
              else {
                if (uVar9 - 8 < 7) {
                  ppVVar13 = SmallArray<VmValue_*,_4U>::operator[]
                                       ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0);
                  if ((VmConstant *)*ppVVar13 == pVVar7) goto LAB_001b6be0;
                  uVar9 = *(uint *)&value[1]._vptr_VmValue;
                }
                if (uVar9 == 0x1b) {
                  ppVVar13 = SmallArray<VmValue_*,_4U>::operator[]
                                       ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0);
                  if (((VmConstant *)*ppVVar13 == pVVar7) ||
                     (ppVVar13 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,2),
                     (VmConstant *)*ppVVar13 == pVVar7)) goto LAB_001b6be0;
                  uVar9 = *(uint *)&value[1]._vptr_VmValue;
                }
                if (uVar9 == 0x1a) {
                  ppVVar13 = SmallArray<VmValue_*,_4U>::operator[]
                                       ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,0);
                  if ((VmConstant *)*ppVVar13 == pVVar7) goto LAB_001b6be0;
                  uVar9 = *(uint *)&value[1]._vptr_VmValue;
                }
                if (uVar9 - 0x1f < 2) {
                  bVar8 = true;
                  if (pVVar7->isReference == true) goto LAB_001b6be0;
                }
                else {
                  bVar8 = true;
                  if ((uVar9 - 0x33 < 0x11) &&
                     (ppVVar13 = SmallArray<VmValue_*,_4U>::operator[]
                                           ((SmallArray<VmValue_*,_4U> *)&value[1].typeID,1),
                     (VmConstant *)*ppVVar13 == pVVar7)) goto LAB_001b6be0;
                }
              }
              bVar16 = bVar8;
            }
          }
          if (ctx->showUsers != false) {
            Print(ctx,"]");
          }
          if (!bVar16) {
            Print(ctx," noalias");
          }
          if (pVVar6->isAlloca == true) {
            Print(ctx," alloca");
          }
          pMVar4 = pVVar6->importModule;
          if (pMVar4 != (ModuleData *)0x0) {
            Print(ctx," from \'%.*s\'",
                  (ulong)(uint)(*(int *)&(pMVar4->name).end - (int)(pMVar4->name).begin));
          }
          PrintLine(ctx);
        }
      }
    }
    PrintLine(ctx,"{");
    ppVVar17 = &function->firstBlock;
    while (block = *ppVVar17, block != (VmBlock *)0x0) {
      PrintBlock(ctx,block);
      ppVVar17 = &block->nextSibling;
    }
    PrintLine(ctx,"}");
    PrintLine(ctx);
    return;
  }
  if ((pFVar1->importModule == (ModuleData *)0x0) || ((function->super_VmValue).users.count != 0)) {
    PrintUsers(ctx,&function->super_VmValue,true);
    Print(ctx,"function ");
    PrintType(ctx,function->returnType);
    pcVar19 = (pFVar1->name->name).begin;
    Print(ctx," %.*s.f%04x(",(ulong)(uint)(*(int *)&(pFVar1->name->name).end - (int)pcVar19),pcVar19
          ,(ulong)pFVar1->uniqueId);
    pcVar19 = "";
    for (uVar18 = 0; uVar18 < (pFVar1->arguments).count; uVar18 = uVar18 + 1) {
      pAVar10 = SmallArray<ArgumentData,_4U>::operator[](&pFVar1->arguments,uVar18);
      pcVar15 = ", ";
      if (uVar18 == 0) {
        pcVar15 = "";
      }
      pcVar14 = "";
      if (pAVar10->isExplicit != false) {
        pcVar14 = "explicit ";
      }
      pcVar2 = (pAVar10->type->name).begin;
      pcVar3 = (pAVar10->name->name).begin;
      Print(ctx,"%s%s%.*s %.*s",pcVar15,pcVar14,
            (ulong)(uint)(*(int *)&(pAVar10->type->name).end - (int)pcVar2),pcVar2,
            (ulong)(uint)(*(int *)&(pAVar10->name->name).end - (int)pcVar3),pcVar3);
    }
    if (function->firstBlock == (VmBlock *)0x0) {
      pcVar19 = ";";
    }
    Print(ctx,")%s",pcVar19);
    pMVar4 = pFVar1->importModule;
    if (pMVar4 != (ModuleData *)0x0) {
      Print(ctx," from \'%.*s\'",
            (ulong)(uint)(*(int *)&(pMVar4->name).end - (int)(pMVar4->name).begin));
    }
    PrintLine(ctx);
    if (function->firstBlock != (VmBlock *)0x0) goto LAB_001b6a5d;
  }
  return;
}

Assistant:

void PrintFunction(InstructionVMGraphContext &ctx, VmFunction *function)
{
	if(FunctionData *fData = function->function)
	{
		if(fData->importModule != NULL && function->users.empty())
			return;

		PrintUsers(ctx, function, true);

		Print(ctx, "function ");
		PrintType(ctx, function->returnType);
		Print(ctx, " %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		Print(ctx, ")%s", function->firstBlock == NULL ? ";" : "");

		if(fData->importModule)
			Print(ctx, " from '%.*s'", FMT_ISTR(fData->importModule->name));

		PrintLine(ctx);

		if(function->firstBlock == NULL)
			return;
	}
	else
	{
		PrintLine(ctx, "function global()");
	}

	if(ScopeData *scope = function->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			if(ctx.showUsers)
				Print(ctx, " [");

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(ctx.showUsers)
					{
						if(i != 0 || k != 0)
							Print(ctx, ", ");
					}

					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						if(ctx.showUsers)
							PrintName(ctx, inst, inst->parent->parent != function, true);

						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
						{
							simpleUse = true;
						}
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
						{
							simpleUse = true;
						}
						else if(inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL)
						{
							if(user->isReference)
								simpleUse = true;
							else
								simpleUse = false;
						}
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
						{
							simpleUse = true;
						}
						else
						{
							simpleUse = false;
						}

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(ctx.showUsers)
				Print(ctx, "]");

			if(!addressTaken)
				Print(ctx, " noalias");

			if(variable->isAlloca)
				Print(ctx, " alloca");

			if(variable->importModule)
				Print(ctx, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx);
		}
	}

	PrintLine(ctx, "{");

	for(VmBlock *value = function->firstBlock; value; value = value->nextSibling)
		PrintBlock(ctx, value);
	
	PrintLine(ctx, "}");
	PrintLine(ctx);
}